

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstantDelta
               (int constant,int frame_of_reference,idx_t count,int *values,bool *validity,
               void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  bitpacking_metadata_encoded_t encoded_value;
  
  FlushAndCreateSegmentIfFull((BitpackingCompressionState<int,_true,_int> *)data_ptr,8,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  lVar3 = *(long *)((long)data_ptr + 0x48);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x3000000;
  piVar4 = *(int **)((long)data_ptr + 0x40);
  *piVar4 = frame_of_reference;
  piVar4[1] = constant;
  *(int **)((long)data_ptr + 0x40) = piVar4 + 2;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}